

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha512_Transform(sha2_word64 *state_in,sha2_word64 *data,sha2_word64 *state_out)

{
  sha2_word64 sVar1;
  sha2_word64 sVar2;
  sha2_word64 sVar3;
  long lVar4;
  sha2_word64 sVar5;
  sha2_word64 sVar6;
  ulong uVar7;
  sha2_word64 sVar8;
  ulong uVar9;
  ulong uVar10;
  uint local_10c;
  int j;
  sha2_word64 W512 [16];
  sha2_word64 T2;
  sha2_word64 T1;
  sha2_word64 s1;
  sha2_word64 s0;
  sha2_word64 h;
  sha2_word64 g;
  sha2_word64 f;
  sha2_word64 e;
  sha2_word64 d;
  sha2_word64 c;
  sha2_word64 b;
  sha2_word64 a;
  sha2_word64 *state_out_local;
  sha2_word64 *data_local;
  sha2_word64 *state_in_local;
  
  b = *state_in;
  c = state_in[1];
  d = state_in[2];
  e = state_in[3];
  f = state_in[4];
  g = state_in[5];
  h = state_in[6];
  s0 = state_in[7];
  local_10c = 0;
  state_out_local = data;
  do {
    sVar1 = K512[(int)local_10c];
    sVar8 = *state_out_local;
    W512[(long)(int)local_10c + -1] = sVar8;
    lVar4 = s0 + ((f >> 0xe | f << 0x32) ^ (f >> 0x12 | f << 0x2e) ^ (f >> 0x29 | f << 0x17)) +
            (f & g ^ (f ^ 0xffffffffffffffff) & h) + sVar1 + sVar8;
    uVar7 = b & c;
    uVar9 = b & d;
    uVar10 = c & d;
    s0 = h;
    h = g;
    g = f;
    f = e + lVar4;
    e = d;
    d = c;
    c = b;
    b = lVar4 + ((b >> 0x1c | b << 0x24) ^ (b >> 0x22 | b << 0x1e) ^ (b >> 0x27 | b << 0x19)) +
                (uVar7 ^ uVar9 ^ uVar10);
    local_10c = local_10c + 1;
    sVar1 = h;
    sVar8 = g;
    sVar5 = f;
    sVar2 = d;
    sVar3 = c;
    sVar6 = b;
    state_out_local = state_out_local + 1;
  } while ((int)local_10c < 0x10);
  do {
    b = sVar6;
    c = sVar3;
    d = sVar2;
    f = sVar5;
    g = sVar8;
    h = sVar1;
    uVar7 = W512[(long)(int)(local_10c + 1 & 0xf) + -1];
    uVar9 = W512[(long)(int)(local_10c + 0xe & 0xf) + -1];
    sVar1 = K512[(int)local_10c];
    sVar8 = ((uVar9 >> 0x13 | uVar9 << 0x2d) ^ (uVar9 >> 0x3d | uVar9 << 3) ^ uVar9 >> 6) +
            W512[(long)(int)(local_10c + 9 & 0xf) + -1] +
            ((uVar7 >> 1 | uVar7 << 0x3f) ^ (uVar7 >> 8 | uVar7 << 0x38) ^ uVar7 >> 7) +
            W512[(long)(int)(local_10c & 0xf) + -1];
    W512[(long)(int)(local_10c & 0xf) + -1] = sVar8;
    lVar4 = s0 + ((f >> 0xe | f << 0x32) ^ (f >> 0x12 | f << 0x2e) ^ (f >> 0x29 | f << 0x17)) +
            (f & g ^ (f ^ 0xffffffffffffffff) & h) + sVar1 + sVar8;
    s0 = h;
    sVar5 = e + lVar4;
    e = d;
    sVar6 = lVar4 + ((b >> 0x1c | b << 0x24) ^ (b >> 0x22 | b << 0x1e) ^ (b >> 0x27 | b << 0x19)) +
                    (b & c ^ b & d ^ c & d);
    local_10c = local_10c + 1;
    sVar1 = g;
    sVar8 = f;
    sVar2 = c;
    sVar3 = b;
  } while ((int)local_10c < 0x50);
  *state_out = *state_in + sVar6;
  state_out[1] = state_in[1] + b;
  state_out[2] = state_in[2] + c;
  state_out[3] = state_in[3] + d;
  state_out[4] = state_in[4] + sVar5;
  state_out[5] = state_in[5] + f;
  state_out[6] = state_in[6] + g;
  state_out[7] = state_in[7] + h;
  return;
}

Assistant:

void sha512_Transform(const sha2_word64* state_in, const sha2_word64* data, sha2_word64* state_out) {
	sha2_word64	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word64	T1, T2, W512[16];
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = state_in[0];
	b = state_in[1];
	c = state_in[2];
	d = state_in[3];
	e = state_in[4];
	f = state_in[5];
	g = state_in[6];
	h = state_in[7];

	j = 0;
	do {
		/* Apply the SHA-512 compression function to update a..h with copy */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + (W512[j] = *data++);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W512[(j+1)&0x0f];
		s0 = sigma0_512(s0);
		s1 = W512[(j+14)&0x0f];
		s1 =  sigma1_512(s1);

		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] +
		     (W512[j&0x0f] += s1 + W512[(j+9)&0x0f] + s0);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 80);

	/* Compute the current intermediate hash value */
	state_out[0] = state_in[0] + a;
	state_out[1] = state_in[1] + b;
	state_out[2] = state_in[2] + c;
	state_out[3] = state_in[3] + d;
	state_out[4] = state_in[4] + e;
	state_out[5] = state_in[5] + f;
	state_out[6] = state_in[6] + g;
	state_out[7] = state_in[7] + h;
}